

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::FenceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,FenceTestInstance *this)

{
  VkDevice *ppVVar1;
  VkPhysicalDevice pVVar2;
  DeviceInterface *vk;
  VkDevice device;
  MultiQueues *this_00;
  long *plVar3;
  OperationContext *context;
  long *plVar4;
  VkCommandPool obj;
  Handle<(vk::HandleType)24> HVar5;
  Handle<(vk::HandleType)24> HVar6;
  VkCommandBuffer_s *commandBuffer;
  VkCommandBuffer_s *commandBuffer_00;
  VkQueueFlags flagsWrite;
  VkQueueFlags flagsRead;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Resource *pRVar10;
  void *__s2;
  long lVar11;
  pointer pQVar12;
  undefined1 auVar13 [16];
  SyncInfo SVar14;
  ulong local_170;
  UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  resource;
  long *local_148;
  long local_140;
  long local_138 [2];
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  SyncInfo local_e0;
  SyncInfo local_d0;
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  queuePairs;
  VkCommandBuffer cmdBuffers [2];
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  
  pVVar2 = (this->super_BaseTestInstance).m_opContext.m_physicalDevice;
  vk = *(DeviceInterface **)(pVVar2 + 8);
  device = *(VkDevice *)(pVVar2 + 0x18);
  this_00 = (MultiQueues *)(this->super_BaseTestInstance).m_opContext.m_vki;
  flagsWrite = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.ptr + 0x18))();
  plVar3 = *(long **)&(this->super_BaseTestInstance).m_resource.
                      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                      .m_data.field_0x8;
  flagsRead = (**(code **)(*plVar3 + 0x18))
                        (plVar3,(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  MultiQueues::getQueuesPairs(&queuePairs,this_00,flagsWrite,flagsRead);
  pQVar12 = queuePairs.
            super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)queuePairs.
                         super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0) {
    local_170 = 0;
    do {
      pQVar12 = queuePairs.
                super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar10 = (Resource *)operator_new(0x80);
      context = (OperationContext *)(this->super_BaseTestInstance).m_opContext.m_physicalDevice;
      uVar7 = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                    .m_data.ptr + 0x10))();
      uVar8 = (**(code **)(**(long **)&(this->super_BaseTestInstance).m_resource.
                                       super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                       .m_data.field_0x8 + 0x10))();
      cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
      cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      Resource::Resource(pRVar10,context,
                         (ResourceDescription *)
                         &(this->super_BaseTestInstance).m_opContext.m_allocator,uVar8 | uVar7,
                         VK_SHARING_MODE_EXCLUSIVE,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)cmdPool);
      resource.
      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
      .m_data.ptr = pRVar10;
      if (cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        operator_delete((void *)cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                object.m_internal,
                        (long)cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                              deleter.m_device -
                        cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
      }
      pRVar10 = (this->super_BaseTestInstance).m_resource.
                super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                .m_data.ptr;
      (**(code **)(*(long *)pRVar10 + 0x28))
                (cmdPool,pRVar10,(this->super_BaseTestInstance).m_opContext.m_physicalDevice,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr);
      HVar5 = cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object;
      plVar3 = *(long **)&(this->super_BaseTestInstance).m_resource.
                          super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                          .m_data.field_0x8;
      (**(code **)(*plVar3 + 0x28))
                (cmdPool,plVar3,(this->super_BaseTestInstance).m_opContext.m_physicalDevice,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr);
      HVar6 = cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object;
      ::vk::createCommandPool
                (cmdPool,vk,device,2,pQVar12[local_170].familyIndexWrite,
                 (VkAllocationCallbacks *)0x0);
      pQVar12 = pQVar12 + local_170;
      ::vk::createCommandPool
                (cmdPool + 1,vk,device,2,pQVar12->familyIndexRead,(VkAllocationCallbacks *)0x0);
      makeCommandBuffer(ptrCmdBuffer,vk,device,
                        (VkCommandPool)
                        cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
      makeCommandBuffer(ptrCmdBuffer + 1,vk,device,
                        (VkCommandPool)
                        cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
      commandBuffer_00 = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      commandBuffer = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      SVar14 = (SyncInfo)(**(code **)(*(long *)HVar5.m_internal + 0x18))(HVar5.m_internal);
      local_d0 = SVar14;
      SVar14 = (SyncInfo)(**(code **)(*(long *)HVar6.m_internal + 0x18))(HVar6.m_internal);
      local_e0 = SVar14;
      beginCommandBuffer(vk,commandBuffer);
      (**(code **)(*(long *)HVar5.m_internal + 0x10))(HVar5.m_internal,commandBuffer);
      createBarrierMultiQueue
                (vk,cmdBuffers,&local_d0,&local_e0,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr,pQVar12->familyIndexWrite,pQVar12->familyIndexRead,
                 *(VkSharingMode *)
                  &(this->super_BaseTestInstance).m_writeOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   .m_data.ptr,false);
      endCommandBuffer(vk,commandBuffer);
      submitCommandsAndWait(vk,device,pQVar12->queueWrite,commandBuffer);
      beginCommandBuffer(vk,commandBuffer_00);
      createBarrierMultiQueue
                (vk,cmdBuffers + 1,&local_d0,&local_e0,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr,pQVar12->familyIndexWrite,pQVar12->familyIndexRead,
                 *(VkSharingMode *)
                  &(this->super_BaseTestInstance).m_writeOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   .m_data.ptr,true);
      (**(code **)(*(long *)HVar6.m_internal + 0x10))(HVar6.m_internal,commandBuffer_00);
      endCommandBuffer(vk,commandBuffer_00);
      submitCommandsAndWait(vk,device,pQVar12->queueRead,commandBuffer_00);
      auVar13 = (**(code **)(*(long *)HVar5.m_internal + 0x20))(HVar5.m_internal);
      (**(code **)(*(long *)HVar6.m_internal + 0x20))(HVar6.m_internal);
      iVar9 = bcmp(auVar13._8_8_,__s2,auVar13._0_8_);
      if (iVar9 != 0) {
        local_148 = local_138;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"Memory contents don\'t match","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_148,
                   local_140 + (long)local_148);
        if (local_148 != local_138) {
          operator_delete(local_148,local_138[0] + 1);
        }
      }
      lVar11 = 0x20;
      do {
        plVar3 = *(long **)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                   object + lVar11);
        if (plVar3 != (long *)0x0) {
          plVar4 = *(long **)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                     deleter.m_deviceIface + lVar11);
          local_148 = plVar3;
          (**(code **)(*plVar4 + 0x240))
                    (plVar4,*(undefined8 *)
                             ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                     deleter.m_device + lVar11),
                     *(undefined8 *)
                      ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                              m_pool.m_internal + lVar11),1);
        }
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device +
         lVar11) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
                 m_internal + lVar11) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar11) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
         + lVar11) = 0;
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != -0x20);
      lVar11 = 0;
      do {
        obj.m_internal =
             *(deUint64 *)
              ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal + lVar11);
        if (obj.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
                     ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                             deleter.m_deviceIface + lVar11),obj);
        }
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device +
         lVar11) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_allocator + lVar11) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
         + lVar11) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_deviceIface + lVar11) = 0;
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != -0x40);
      (**(code **)(*(long *)HVar6.m_internal + 8))(HVar6.m_internal);
      (**(code **)(*(long *)HVar5.m_internal + 8))(HVar5.m_internal);
      de::details::
      UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
      ::reset(&resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
             );
      if (iVar9 != 0) goto LAB_007daf98;
      local_170 = local_170 + 1;
      pQVar12 = queuePairs.
                super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (local_170 <
             (uint)((int)((ulong)((long)queuePairs.
                                        super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)queuePairs.
                                       super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555));
  }
  ppVVar1 = &cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)ppVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)cmdPool,"OK","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             (long)&(cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                    m_deviceIface)->_vptr_DeviceInterface +
             cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  queuePairs.
  super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  ._M_impl.super__Vector_impl_data._M_start = pQVar12;
  if ((VkDevice *)cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
      != ppVVar1) {
    operator_delete((void *)cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                            m_internal,
                    (ulong)(cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter
                            .m_device + 1));
  }
LAB_007daf98:
  if (queuePairs.
      super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(queuePairs.
                    super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate (void)
	{
		enum {WRITE=0, READ, COUNT};
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
		VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[WRITE], *ptrCmdBuffer[READ]};
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, cmdBuffers[WRITE]);

		m_writeOp->recordCommands(cmdBuffers[WRITE]);

		if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffers[WRITE],  writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}

		endCommandBuffer(vk, cmdBuffers[WRITE]);

		submitCommandsAndWait(vk, device, queue, cmdBuffers[WRITE]);

		beginCommandBuffer(vk, cmdBuffers[READ]);

		m_readOp->recordCommands(cmdBuffers[READ]);

		endCommandBuffer(vk, cmdBuffers[READ]);

		submitCommandsAndWait(vk, device, queue, cmdBuffers[READ]);

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}